

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
::find_or_prepare_insert_non_soo<std::__cxx11::string>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  size_t size;
  ulong uVar2;
  ulong uVar3;
  pointer __s2;
  size_t sVar4;
  size_t __n;
  uint uVar5;
  ushort uVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  ushort uVar23;
  int iVar24;
  MixingHashState MVar25;
  long lVar26;
  anon_union_8_1_a8a14541_for_iterator_2 aVar27;
  ctrl_t *pcVar28;
  long lVar29;
  uint uVar30;
  bool bVar31;
  uint64_t v;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  FindInfo FVar42;
  __m128i match;
  ulong local_a8;
  char cVar35;
  char cVar38;
  char cVar39;
  char cVar40;
  
  size = key->_M_string_length;
  MVar25 = hash_internal::MixingHashState::combine_contiguous
                     ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                      (uchar *)(key->_M_dataplus)._M_p,size);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = MVar25.state_ + size;
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar34 = SUB168(auVar36 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar36 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar3 = *(ulong *)(this + 0x10);
  uVar32 = (uVar34 >> 7 ^ uVar3 >> 0xc) & uVar2;
  auVar36 = ZEXT216(CONCAT11((char)uVar34,(char)uVar34) & 0x7f7f);
  auVar36 = pshuflw(auVar36,auVar36,0);
  pcVar28 = (__return_storage_ptr__->first).ctrl_;
  aVar27 = (__return_storage_ptr__->first).field_1;
  bVar31 = __return_storage_ptr__->second;
  local_a8 = 0;
  do {
    pcVar1 = (char *)(uVar3 + uVar32);
    cVar22 = *pcVar1;
    cVar7 = pcVar1[1];
    cVar8 = pcVar1[2];
    cVar9 = pcVar1[3];
    cVar10 = pcVar1[4];
    cVar11 = pcVar1[5];
    cVar12 = pcVar1[6];
    cVar13 = pcVar1[7];
    cVar14 = pcVar1[8];
    cVar15 = pcVar1[9];
    cVar16 = pcVar1[10];
    cVar17 = pcVar1[0xb];
    cVar18 = pcVar1[0xc];
    cVar19 = pcVar1[0xd];
    cVar20 = pcVar1[0xe];
    cVar21 = pcVar1[0xf];
    cVar35 = auVar36[0];
    auVar37[0] = -(cVar35 == cVar22);
    cVar38 = auVar36[1];
    auVar37[1] = -(cVar38 == cVar7);
    cVar39 = auVar36[2];
    auVar37[2] = -(cVar39 == cVar8);
    cVar40 = auVar36[3];
    auVar37[3] = -(cVar40 == cVar9);
    auVar37[4] = -(cVar35 == cVar10);
    auVar37[5] = -(cVar38 == cVar11);
    auVar37[6] = -(cVar39 == cVar12);
    auVar37[7] = -(cVar40 == cVar13);
    auVar37[8] = -(cVar35 == cVar14);
    auVar37[9] = -(cVar38 == cVar15);
    auVar37[10] = -(cVar39 == cVar16);
    auVar37[0xb] = -(cVar40 == cVar17);
    auVar37[0xc] = -(cVar35 == cVar18);
    auVar37[0xd] = -(cVar38 == cVar19);
    auVar37[0xe] = -(cVar39 == cVar20);
    auVar37[0xf] = -(cVar40 == cVar21);
    uVar23 = (ushort)(SUB161(auVar37 >> 7,0) & 1) | (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe | (ushort)(auVar37[0xf] >> 7) << 0xf;
    uVar30 = (uint)uVar23;
    if (uVar23 != 0) {
      lVar26 = *(long *)(this + 0x18);
      __s2 = (key->_M_dataplus)._M_p;
      sVar4 = key->_M_string_length;
      do {
        uVar5 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar33 = uVar5 + uVar32 & uVar2;
        lVar29 = uVar33 * 0x20;
        __n = *(size_t *)(lVar26 + 8 + lVar29);
        if ((__n == sVar4) &&
           ((__n == 0 || (iVar24 = bcmp(*(void **)(lVar26 + lVar29),__s2,__n), iVar24 == 0)))) {
          (__return_storage_ptr__->first).field_1 = aVar27;
          __return_storage_ptr__->second = bVar31;
          (__return_storage_ptr__->first).ctrl_ = pcVar28;
          if (*(long *)(this + 0x10) != 0) {
            (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar33);
            (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar26 + lVar29);
            __return_storage_ptr__->second = false;
            return __return_storage_ptr__;
          }
          goto LAB_0017df8d;
        }
        uVar23 = (ushort)(uVar30 - 1) & (ushort)uVar30;
        uVar30 = CONCAT22((short)(uVar30 - 1 >> 0x10),uVar23);
      } while (uVar23 != 0);
    }
    auVar41[0] = -(cVar22 == -0x80);
    auVar41[1] = -(cVar7 == -0x80);
    auVar41[2] = -(cVar8 == -0x80);
    auVar41[3] = -(cVar9 == -0x80);
    auVar41[4] = -(cVar10 == -0x80);
    auVar41[5] = -(cVar11 == -0x80);
    auVar41[6] = -(cVar12 == -0x80);
    auVar41[7] = -(cVar13 == -0x80);
    auVar41[8] = -(cVar14 == -0x80);
    auVar41[9] = -(cVar15 == -0x80);
    auVar41[10] = -(cVar16 == -0x80);
    auVar41[0xb] = -(cVar17 == -0x80);
    auVar41[0xc] = -(cVar18 == -0x80);
    auVar41[0xd] = -(cVar19 == -0x80);
    auVar41[0xe] = -(cVar20 == -0x80);
    auVar41[0xf] = -(cVar21 == -0x80);
    uVar23 = (ushort)(SUB161(auVar41 >> 7,0) & 1) | (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe | (ushort)(auVar41[0xf] >> 7) << 0xf;
    if (uVar23 == 0) {
      if (*(ulong *)this < local_a8 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar31;
        (__return_storage_ptr__->first).ctrl_ = pcVar28;
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>, K = std::basic_string<char>]"
                     );
      }
      uVar32 = uVar32 + local_a8 + 0x10 & uVar2;
      local_a8 = local_a8 + 0x10;
    }
    else {
      cVar22 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         (*(ulong *)this,uVar34,*(ctrl_t **)(this + 0x10));
      if (cVar22 == '\0') {
        uVar30 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
      }
      else {
        uVar6 = 0xf;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar30 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      FVar42.offset = uVar30 + uVar32 & uVar2;
      FVar42.probe_length = local_a8;
      lVar26 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,uVar34,FVar42,
                          (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar27;
        __return_storage_ptr__->second = bVar31;
        (__return_storage_ptr__->first).ctrl_ = pcVar28;
LAB_0017df8d:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>]"
                     );
      }
      pcVar28 = (ctrl_t *)(*(long *)(this + 0x10) + lVar26);
      aVar27.slot_ = (slot_type *)(lVar26 * 0x20 + *(long *)(this + 0x18));
      bVar31 = true;
    }
    if (uVar23 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar27;
      __return_storage_ptr__->second = bVar31;
      (__return_storage_ptr__->first).ctrl_ = pcVar28;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }